

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                   (string *msg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   LogicalType *params_2,LogicalType *params_3)

{
  string *in_RCX;
  LogicalType *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *in_R8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *unaff_retaddr
  ;
  string *in_stack_00000008;
  LogicalType *in_stack_00000020;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  size_t num_args;
  LogicalType *in_stack_fffffffffffffee8;
  LogicalType *in_stack_fffffffffffffef0;
  string local_a0 [48];
  string local_70 [56];
  undefined8 local_38;
  LogicalType *params_1_00;
  string *param;
  
  local_38 = 4;
  params_1_00 = in_RDX;
  param = in_RDI;
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             0xe69ac1);
  ::std::__cxx11::string::string(local_70,(string *)in_RDX);
  ::std::__cxx11::string::string(local_a0,in_RCX);
  LogicalType::LogicalType(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  LogicalType::LogicalType(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (in_stack_00000008,unaff_retaddr,param,in_RSI,params_1_00,in_stack_00000020);
  LogicalType::~LogicalType((LogicalType *)0xe69b55);
  LogicalType::~LogicalType((LogicalType *)0xe69b5f);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::~string(local_70);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(in_R8);
  return in_RDI;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}